

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O2

void __thiscall
glcts::ShaderTextureImageSamplesGLSLExtensionEnableTest::
ShaderTextureImageSamplesGLSLExtensionEnableTest
          (ShaderTextureImageSamplesGLSLExtensionEnableTest *this,Context *context)

{
  ShaderTextureImageSamplesTestBase::ShaderTextureImageSamplesTestBase
            (&this->super_ShaderTextureImageSamplesTestBase,context,"glsl_extension_enable",
             "Verifies a shader with \"#extension GL_ARB_shader_texture_image_samples : enable\" line defines a corresponding pre-processor macro."
            );
  (this->super_ShaderTextureImageSamplesTestBase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__TestCase_01dd3108;
  return;
}

Assistant:

ShaderTextureImageSamplesGLSLExtensionEnableTest::ShaderTextureImageSamplesGLSLExtensionEnableTest(
	deqp::Context& context)
	: ShaderTextureImageSamplesTestBase(
		  context, "glsl_extension_enable",
		  "Verifies a shader with \"#extension GL_ARB_shader_texture_image_samples : enable\" "
		  "line defines a corresponding pre-processor macro.")
{
	/* Left blank on purpose */
}